

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_data_source_seek_to_second(ma_data_source *pDataSource,float seekPointInSeconds)

{
  ma_result mVar1;
  ulong uVar2;
  ma_data_source_base *pDataSourceBase;
  uint uVar3;
  float fVar4;
  ma_uint32 sampleRate;
  ma_uint32 channels;
  ma_format format;
  uint local_24;
  undefined1 local_20 [4];
  undefined1 local_1c [4];
  
  if (pDataSource != (ma_data_source *)0x0) {
    if (*(code **)(*pDataSource + 0x10) == (code *)0x0) {
      mVar1 = MA_NOT_IMPLEMENTED;
      fVar4 = 0.0;
    }
    else {
      mVar1 = (**(code **)(*pDataSource + 0x10))(pDataSource,local_1c,local_20,&local_24,0,0);
      uVar3 = 0;
      if (mVar1 == MA_SUCCESS) {
        uVar3 = local_24;
      }
      fVar4 = (float)uVar3;
    }
    if (mVar1 == MA_SUCCESS) {
      if (*(code **)(*pDataSource + 8) == (code *)0x0) {
        mVar1 = MA_NOT_IMPLEMENTED;
      }
      else {
        uVar2 = (ulong)(fVar4 * seekPointInSeconds);
        uVar2 = (long)(fVar4 * seekPointInSeconds - 9.223372e+18) & (long)uVar2 >> 0x3f | uVar2;
        mVar1 = MA_INVALID_OPERATION;
        if (uVar2 <= *(ulong *)((long)pDataSource + 0x10)) {
          mVar1 = (**(code **)(*pDataSource + 8))
                            (pDataSource,uVar2 + *(long *)((long)pDataSource + 8));
        }
      }
    }
    return mVar1;
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_data_source_seek_to_second(ma_data_source* pDataSource, float seekPointInSeconds)
{
    ma_uint64 frameIndex;
    ma_uint32 sampleRate;
    ma_result result;

    if (pDataSource == NULL) {
        return MA_INVALID_ARGS;
    }

    result = ma_data_source_get_data_format(pDataSource, NULL, NULL, &sampleRate, NULL, 0);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* We need PCM frames instead of seconds */
    frameIndex = (ma_uint64)(seekPointInSeconds * sampleRate);

    return ma_data_source_seek_to_pcm_frame(pDataSource, frameIndex);
}